

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O3

void FunctionalTester<unsigned_short,_void>::Test(void)

{
  long lVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  size_t sVar7;
  byte bVar8;
  ulong uVar9;
  uint uVar10;
  ulong x;
  char *tmp_finish;
  char cVar11;
  undefined1 auStack_144 [68];
  undefined1 *puStack_100;
  char acStack_f8 [8];
  buf_t buf2;
  byte local_b0;
  char local_af;
  char local_ae;
  char local_ad [5];
  buf_t buf1;
  undefined8 local_58;
  undefined8 local_50;
  type_info_t *local_48;
  long local_40;
  TestWatcher<unsigned_short> local_31 [8];
  TestWatcher<unsigned_short> tw;
  
  puStack_100 = (undefined1 *)0x10665b;
  TestWatcher<unsigned_short>::TestWatcher(local_31);
  cVar11 = '0';
  lVar1 = (long)&local_50 + 4;
  x = 0;
  do {
    uVar9 = (x & 0xff) / 100;
    uVar10 = (uint)x;
    if (x < 0x100) {
      bVar8 = (byte)x;
      if (x < 100) {
        if (x < 10) {
          pcVar5 = &local_af;
        }
        else {
          local_af = cVar11 + ((byte)((uVar10 & 0xff) / 5) & 0xfe) * -5;
          bVar8 = (byte)((uVar10 & 0xff) / 10);
          pcVar5 = &local_ae;
        }
        local_b0 = bVar8 | 0x30;
      }
      else {
        cVar2 = (char)((uVar10 & 0xff) * 0x29 >> 0xc);
        local_b0 = cVar2 + 0x30;
        uVar6 = uVar9 * -100 + x;
        if (uVar6 < 10) {
          local_ae = (char)uVar9 * -100 + '0' + bVar8;
          local_af = '0';
        }
        else {
          cVar3 = (char)(uVar6 / 10);
          local_af = cVar3 + '0';
          local_ae = cVar2 * -100 + bVar8 + cVar3 * -10 + '0';
        }
        pcVar5 = local_ad;
      }
    }
    else {
      puStack_100 = (undefined1 *)0x106697;
      pcVar5 = int2str::impl::detail<10000ull>::convert<char*>(x,(char *)&local_b0);
    }
    *pcVar5 = '\0';
    buf2._M_elems[0x28] = '\0';
    buf2._M_elems[0x29] = '\0';
    buf2._M_elems[0x2a] = '\0';
    buf2._M_elems[0x2b] = '\0';
    buf2._M_elems[0x2c] = '\0';
    buf2._M_elems[0x2d] = '\0';
    buf2._M_elems[0x2e] = '\0';
    buf2._M_elems[0x2f] = '\0';
    buf2._M_elems[0x30] = '\0';
    buf2._M_elems[0x31] = '\0';
    buf2._M_elems[0x32] = '\0';
    buf2._M_elems[0x33] = '\0';
    buf2._M_elems[0x34] = '\0';
    buf2._M_elems[0x35] = '\0';
    buf2._M_elems[0x36] = '\0';
    buf2._M_elems[0x37] = '\0';
    buf2._M_elems[0x18] = '\0';
    buf2._M_elems[0x19] = '\0';
    buf2._M_elems[0x1a] = '\0';
    buf2._M_elems[0x1b] = '\0';
    buf2._M_elems[0x1c] = '\0';
    buf2._M_elems[0x1d] = '\0';
    buf2._M_elems[0x1e] = '\0';
    buf2._M_elems[0x1f] = '\0';
    buf2._M_elems[0x20] = '\0';
    buf2._M_elems[0x21] = '\0';
    buf2._M_elems[0x22] = '\0';
    buf2._M_elems[0x23] = '\0';
    buf2._M_elems[0x24] = '\0';
    buf2._M_elems[0x25] = '\0';
    buf2._M_elems[0x26] = '\0';
    buf2._M_elems[0x27] = '\0';
    buf2._M_elems[8] = '\0';
    buf2._M_elems[9] = '\0';
    buf2._M_elems[10] = '\0';
    buf2._M_elems[0xb] = '\0';
    buf2._M_elems[0xc] = '\0';
    buf2._M_elems[0xd] = '\0';
    buf2._M_elems[0xe] = '\0';
    buf2._M_elems[0xf] = '\0';
    buf2._M_elems[0x10] = '\0';
    buf2._M_elems[0x11] = '\0';
    buf2._M_elems[0x12] = '\0';
    buf2._M_elems[0x13] = '\0';
    buf2._M_elems[0x14] = '\0';
    buf2._M_elems[0x15] = '\0';
    buf2._M_elems[0x16] = '\0';
    buf2._M_elems[0x17] = '\0';
    acStack_f8[0] = '\0';
    acStack_f8[1] = '\0';
    acStack_f8[2] = '\0';
    acStack_f8[3] = '\0';
    acStack_f8[4] = '\0';
    acStack_f8[5] = '\0';
    acStack_f8[6] = '\0';
    acStack_f8[7] = '\0';
    buf2._M_elems[0] = '\0';
    buf2._M_elems[1] = '\0';
    buf2._M_elems[2] = '\0';
    buf2._M_elems[3] = '\0';
    buf2._M_elems[4] = '\0';
    buf2._M_elems[5] = '\0';
    buf2._M_elems[6] = '\0';
    buf2._M_elems[7] = '\0';
    local_48 = (type_info_t *)((long)&local_58 + 2);
    puStack_100 = (undefined1 *)0x1067a3;
    buf1._M_elems._56_4_ = uVar10;
    local_40 = lVar1;
    local_48 = (type_info_t *)
               boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_short,_char>::
               convert((lcast_put_unsigned<std::char_traits<char>,_unsigned_short,_char> *)
                       (buf1._M_elems + 0x38));
    uVar9 = lVar1 - (long)local_48;
    if (0x3f < uVar9) {
      local_58 = &PTR__bad_cast_0010fd30;
      local_50 = (type_info_t *)&unsigned_short::typeinfo;
      local_48 = (type_info_t *)&std::array<char,64ul>::typeinfo;
      puStack_100 = &LAB_001068c4;
      local_40 = lVar1;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)&local_58);
    }
    puStack_100 = (undefined1 *)0x1067c9;
    local_40 = lVar1;
    memcpy(acStack_f8,local_48,uVar9);
    *(undefined1 *)((long)&buf2 + (uVar9 - 8)) = 0;
    puStack_100 = (undefined1 *)0x1067e1;
    iVar4 = strcmp((char *)&local_b0,acStack_f8);
    if (iVar4 != 0) {
      puStack_100 = (undefined1 *)0x10682b;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"FAILED\n",7);
      puStack_100 = (undefined1 *)0x10683a;
      sVar7 = strlen((char *)&local_b0);
      puStack_100 = (undefined1 *)0x10684c;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(char *)&local_b0,sVar7);
      puStack_100 = (undefined1 *)0x106864;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," != ",4);
      puStack_100 = (undefined1 *)0x106873;
      sVar7 = strlen(acStack_f8);
      puStack_100 = (undefined1 *)0x106885;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,acStack_f8,sVar7);
      puStack_100 = (undefined1 *)0x106891;
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      puStack_100 = (undefined1 *)0x10689b;
      exit(1);
    }
    x = x + 1;
    cVar11 = cVar11 + '\x01';
  } while (x != 0xffff);
  puStack_100 = (undefined1 *)0x106801;
  TestWatcher<unsigned_short>::~TestWatcher(local_31);
  return;
}

Assistant:

static void Test()
    {
        TestWatcher<T> const tw;
        typedef std::array<char, 64> buf_t;
        buf_t buf1;
        T const imin = std::numeric_limits<T>::min();
        T const imax = std::numeric_limits<T>::max();
        for (T i = imin; i < imax; ++i)
        {
            int2str::convert_with_zero(i, buf1.data());
#ifdef USE_BOOST
            buf_t buf2 = boost::lexical_cast<buf_t>(i);
#else
            buf_t buf2;
            sprintf(buf2.data(), PrintfFormat<T>(), i);
#endif
            StrcmpAndExit(buf1.data(), buf2.data());
        }
    }